

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_byteArray_primitive_uint32AtPut
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  uint32_t uVar2;
  size_t sVar3;
  sysbvm_size_t sVar4;
  size_t index;
  size_t size;
  sysbvm_byteArray_t *array;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  sVar1 = *arguments;
  sVar3 = sysbvm_tuple_getSizeInBytes(*arguments);
  sVar4 = sysbvm_tuple_size_decode(arguments[1]);
  if (sVar3 < sVar4 + 4) {
    sysbvm_error_outOfBoundsSlotAccess();
  }
  uVar2 = sysbvm_tuple_uint32_decode(arguments[2]);
  *(uint32_t *)(sVar1 + 0x10 + sVar4) = uVar2;
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_byteArray_primitive_uint32AtPut(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_byteArray_t *array = (sysbvm_byteArray_t *)arguments[0];
    size_t size = sysbvm_tuple_getSizeInBytes(arguments[0]);
    size_t index = sysbvm_tuple_size_decode(arguments[1]);
    if(index + 4 > size) sysbvm_error_outOfBoundsSlotAccess();

    *(uint32_t*)(array->elements + index) = sysbvm_tuple_uint32_decode(arguments[2]);
    return SYSBVM_VOID_TUPLE;
}